

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v6_3.c
# Opt level: O2

int can_calc_bittiming_v6_3
              (net_device *dev,can_bittiming *bt,can_bittiming_const *btc,netlink_ext_ack *extack)

{
  uint uVar1;
  uint tseg;
  uint uVar2;
  __u32 _Var3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint local_74;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint tseg2;
  uint tseg1;
  uint local_4c;
  uint local_48;
  uint sample_point_error;
  net_device *local_40;
  can_bittiming_const *local_38;
  
  tseg1 = 0;
  tseg2 = 0;
  local_74 = bt->sample_point;
  if (bt->sample_point == 0) {
    local_74 = 0x2ee;
    if (bt->bitrate < 0xc3501) {
      local_74 = 0x36b;
      if (500000 < bt->bitrate) {
        local_74 = 800;
      }
    }
  }
  uVar6 = (btc->tseg2_min + btc->tseg1_min) * 2;
  local_60 = 0;
  local_64 = 0;
  local_5c = 0xffffffff;
  local_58 = local_5c;
  local_4c = uVar6;
  local_40 = dev;
  local_38 = btc;
  for (uVar5 = (btc->tseg2_max + btc->tseg1_max) * 2 + 1; uVar6 <= uVar5; uVar5 = uVar5 - 1) {
    tseg = uVar5 >> 1;
    uVar2 = (dev->priv).clock.freq;
    uVar1 = bt->bitrate;
    uVar7 = (uVar5 & 1) + uVar2 / (uVar1 * (tseg + 1));
    uVar7 = uVar7 - uVar7 % btc->brp_inc;
    if ((btc->brp_min <= uVar7) && (uVar7 <= btc->brp_max)) {
      uVar2 = uVar2 / ((tseg + 1) * uVar7);
      uVar4 = uVar1 - uVar2;
      uVar8 = -uVar4;
      if (0 < (int)uVar4) {
        uVar8 = uVar4;
      }
      if (uVar8 <= local_58) {
        if (uVar8 < local_58) {
          local_5c = 0xffffffff;
        }
        local_48 = uVar2;
        can_update_sample_point_v6_3(btc,local_74,tseg,&tseg1,&tseg2,&sample_point_error);
        dev = local_40;
        btc = local_38;
        uVar6 = local_4c;
        if ((sample_point_error < local_5c) &&
           (local_5c = sample_point_error, local_60 = uVar7, local_64 = tseg, local_58 = uVar8,
           uVar1 == local_48 && sample_point_error == 0)) goto LAB_00102a37;
      }
    }
  }
  if ((local_58 == 0) || ((uint)(((ulong)local_58 * 1000) / (ulong)bt->bitrate) < 0x33)) {
LAB_00102a37:
    _Var3 = can_update_sample_point_v6_3(btc,local_74,local_64,&tseg1,&tseg2,(uint *)0x0);
    bt->sample_point = _Var3;
    bt->tq = (__u32)(((ulong)local_60 * 1000000000) / (ulong)(dev->priv).clock.freq);
    bt->prop_seg = tseg1 >> 1;
    bt->phase_seg1 = tseg1 - (tseg1 >> 1);
    bt->phase_seg2 = tseg2;
    can_sjw_set_default(bt);
    uVar5 = bt->sjw;
    if (uVar5 <= btc->sjw_max) {
      if (bt->phase_seg1 < uVar5) {
        return -0x16;
      }
      if (bt->phase_seg2 < uVar5) {
        return -0x16;
      }
      bt->brp = local_60;
      bt->bitrate = (local_40->priv).clock.freq /
                    ((bt->phase_seg1 + bt->prop_seg + bt->phase_seg2 + 1) * local_60);
      return 0;
    }
  }
  return -0x16;
}

Assistant:

int can_calc_bittiming(const struct net_device *dev, struct can_bittiming *bt,
		       const struct can_bittiming_const *btc, struct netlink_ext_ack *extack)
{
	struct can_priv *priv = netdev_priv(dev);
	unsigned int bitrate;			/* current bitrate */
	unsigned int bitrate_error;		/* difference between current and nominal value */
	unsigned int best_bitrate_error = UINT_MAX;
	unsigned int sample_point_error;	/* difference between current and nominal value */
	unsigned int best_sample_point_error = UINT_MAX;
	unsigned int sample_point_nominal;	/* nominal sample point */
	unsigned int best_tseg = 0;		/* current best value for tseg */
	unsigned int best_brp = 0;		/* current best value for brp */
	unsigned int brp, tsegall, tseg, tseg1 = 0, tseg2 = 0;
	u64 v64;
	int err;

	/* Use CiA recommended sample points */
	if (bt->sample_point) {
		sample_point_nominal = bt->sample_point;
	} else {
		if (bt->bitrate > 800 * KILO /* BPS */)
			sample_point_nominal = 750;
		else if (bt->bitrate > 500 * KILO /* BPS */)
			sample_point_nominal = 800;
		else
			sample_point_nominal = 875;
	}

	/* tseg even = round down, odd = round up */
	for (tseg = (btc->tseg1_max + btc->tseg2_max) * 2 + 1;
	     tseg >= (btc->tseg1_min + btc->tseg2_min) * 2; tseg--) {
		tsegall = CAN_SYNC_SEG + tseg / 2;

		/* Compute all possible tseg choices (tseg=tseg1+tseg2) */
		brp = priv->clock.freq / (tsegall * bt->bitrate) + tseg % 2;

		/* choose brp step which is possible in system */
		brp = (brp / btc->brp_inc) * btc->brp_inc;
		if (brp < btc->brp_min || brp > btc->brp_max)
			continue;

		bitrate = priv->clock.freq / (brp * tsegall);
		bitrate_error = abs(bt->bitrate - bitrate);

		/* tseg brp biterror */
		if (bitrate_error > best_bitrate_error)
			continue;

		/* reset sample point error if we have a better bitrate */
		if (bitrate_error < best_bitrate_error)
			best_sample_point_error = UINT_MAX;

		can_update_sample_point(btc, sample_point_nominal, tseg / 2,
					&tseg1, &tseg2, &sample_point_error);
		if (sample_point_error >= best_sample_point_error)
			continue;

		best_sample_point_error = sample_point_error;
		best_bitrate_error = bitrate_error;
		best_tseg = tseg / 2;
		best_brp = brp;

		if (bitrate_error == 0 && sample_point_error == 0)
			break;
	}

	if (best_bitrate_error) {
		/* Error in one-tenth of a percent */
		v64 = (u64)best_bitrate_error * 1000;
		do_div(v64, bt->bitrate);
		bitrate_error = (u32)v64;
		if (bitrate_error > CAN_CALC_MAX_ERROR) {
			NL_SET_ERR_MSG_FMT(extack,
					   "bitrate error: %u.%u%% too high",
					   bitrate_error / 10, bitrate_error % 10);
			return -EINVAL;
		}
		NL_SET_ERR_MSG_FMT(extack,
				   "bitrate error: %u.%u%%",
				   bitrate_error / 10, bitrate_error % 10);
	}

	/* real sample point */
	bt->sample_point = can_update_sample_point(btc, sample_point_nominal,
						   best_tseg, &tseg1, &tseg2,
						   NULL);

	v64 = (u64)best_brp * 1000 * 1000 * 1000;
	do_div(v64, priv->clock.freq);
	bt->tq = (u32)v64;
	bt->prop_seg = tseg1 / 2;
	bt->phase_seg1 = tseg1 - bt->prop_seg;
	bt->phase_seg2 = tseg2;

	can_sjw_set_default(bt);

	err = can_sjw_check(dev, bt, btc, extack);
	if (err)
		return err;

	bt->brp = best_brp;

	/* real bitrate */
	bt->bitrate = priv->clock.freq /
		(bt->brp * can_bit_time(bt));

	return 0;
}